

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O3

Ray * pbrt::SpawnRay(Ray *__return_storage_ptr__,Point3fi pi,Normal3f n,Float time,Vector3f d)

{
  float *pfVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  Point3fi PVar6;
  int iVar7;
  float *pfVar8;
  bool in_CF;
  bool in_ZF;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 uVar20;
  undefined8 in_XMM3_Qb;
  float fVar21;
  undefined1 in_register_00001304 [12];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  float local_c;
  undefined8 local_8;
  
  PVar6.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval> =
       pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>;
  auVar19._4_60_ = n._12_60_;
  auVar19._0_4_ = n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar18._8_56_ = n._8_56_;
  auVar18._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  fVar21 = d.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar20 = d.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar17 = auVar18._0_16_;
  auVar13 = vmovshdup_avx(auVar17);
  auVar16._8_8_ = in_XMM3_Qb;
  auVar16._0_8_ = uVar20;
  auVar26 = vmovshdup_avx(auVar16);
  auVar16 = vandps_avx(auVar11,auVar17);
  auVar15 = vandps_avx(auVar13,auVar11);
  auVar14 = vandps_avx(auVar11,auVar19._0_16_);
  auVar12 = ZEXT416((uint)((pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
                           pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low) * 0.5));
  auVar11 = vmulss_avx512f(auVar14,auVar12);
  auVar12 = vfmsub213ss_avx512f(auVar12,auVar14,auVar11);
  auVar14 = vfmadd213ss_fma(auVar26,auVar13,ZEXT416((uint)(auVar19._0_4_ * fVar21)));
  auVar13._4_12_ = in_register_00001304;
  auVar13._0_4_ = fVar21;
  auVar13 = vfmsub231ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar21)),auVar19._0_16_,auVar13);
  auVar13 = vaddss_avx512f(auVar14,auVar13);
  auVar26._8_8_ = 0;
  auVar26._0_4_ = pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar26._4_4_ = pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar14._8_8_ = in_XMM3_Qb;
  auVar14._0_8_ = uVar20;
  auVar14 = vfmadd231ss_avx512f(auVar13,auVar17,auVar14);
  auVar13 = vucomiss_avx512f(auVar14);
  uVar2 = vcmpss_avx512f(auVar14,auVar13,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar14 = vmovshdup_avx(auVar26);
  fVar24 = PVar6.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)((pi.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
                                               auVar14._0_4_) * 0.5)),auVar15,auVar11);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ + auVar12._0_4_)),auVar16,
                            ZEXT416((uint)((fVar24 - pi.super_Point3<pbrt::Interval>.
                                                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                                                     low) * 0.5)));
  fVar9 = auVar16._0_4_;
  auVar15._0_4_ = fVar9 * n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar15._4_4_ = fVar9 * n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar15._8_4_ = fVar9 * n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar15._12_4_ = fVar9 * n._12_4_;
  fVar9 = (float)((uint)bVar3 * (int)-(fVar9 * auVar19._0_4_) +
                 (uint)!bVar3 * (int)(fVar9 * auVar19._0_4_));
  if (!in_CF && !in_ZF) {
    uVar5 = CONCAT44(auVar15._4_4_,auVar15._0_4_);
    auVar15._0_8_ = uVar5 ^ 0x8000000080000000;
    auVar15._8_4_ = -auVar15._8_4_;
    auVar15._12_4_ = -auVar15._12_4_;
  }
  auVar16 = vinsertps_avx(ZEXT416((uint)pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                          ZEXT416((uint)pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  pfVar1 = (float *)((long)&local_8 + 4);
  iVar7 = 0;
  auVar17._0_4_ = fVar24 + auVar16._0_4_;
  auVar17._4_4_ =
       PVar6.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar16._4_4_;
  auVar17._8_4_ = auVar16._8_4_ + 0.0;
  auVar17._12_4_ = auVar16._12_4_ + 0.0;
  auVar12._8_4_ = 0x3f000000;
  auVar12._0_8_ = 0x3f0000003f000000;
  auVar12._12_4_ = 0x3f000000;
  auVar16 = vmulps_avx512vl(auVar17,auVar12);
  local_c = (pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5
            + fVar9;
  fVar24 = auVar15._0_4_;
  auVar23._0_4_ = auVar16._0_4_ + fVar24;
  auVar23._4_4_ = auVar16._4_4_ + auVar15._4_4_;
  auVar23._8_4_ = auVar16._8_4_ + auVar15._8_4_;
  auVar23._12_4_ = auVar16._12_4_ + auVar15._12_4_;
  local_8 = vmovlps_avx(auVar23);
  auVar16 = vmovshdup_avx(auVar15);
  do {
    fVar25 = fVar24;
    if ((iVar7 != 0) && (fVar25 = auVar16._0_4_, iVar7 != 1)) {
      fVar25 = fVar9;
    }
    fVar22 = auVar13._0_4_;
    if (fVar25 <= fVar22) {
      fVar25 = fVar24;
      if ((iVar7 != 0) && (fVar25 = auVar16._0_4_, iVar7 != 1)) {
        fVar25 = fVar9;
      }
      if (fVar25 < fVar22) {
        pfVar8 = (float *)&local_8;
        if ((iVar7 != 0) && (pfVar8 = pfVar1, iVar7 != 1)) {
          pfVar8 = &local_c;
        }
        fVar25 = *pfVar8;
        fVar10 = -INFINITY;
        if (-INFINITY < fVar25) {
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar25),auVar13,0);
          bVar3 = (bool)((byte)uVar2 & 1);
          fVar25 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar25);
          fVar10 = (float)((int)fVar25 + -1 + (uint)(fVar25 <= fVar22) * 2);
        }
        goto LAB_003ec154;
      }
    }
    else {
      pfVar8 = (float *)&local_8;
      if ((iVar7 != 0) && (pfVar8 = pfVar1, iVar7 != 1)) {
        pfVar8 = &local_c;
      }
      fVar25 = *pfVar8;
      fVar10 = INFINITY;
      if (fVar25 < INFINITY) {
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar25),auVar13,0);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar10 = (float)((uint)bVar3 * (int)fVar22 + (uint)!bVar3 * (int)fVar25);
        fVar10 = (float)((-(uint)(fVar10 < fVar22) | 1) + (int)fVar10);
      }
LAB_003ec154:
      pfVar8 = (float *)&local_8;
      if ((iVar7 != 0) && (pfVar8 = pfVar1, iVar7 != 1)) {
        pfVar8 = &local_c;
      }
      *pfVar8 = fVar10;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 3) {
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_8;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y = (float)local_8._4_4_;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = local_c;
      auVar4._8_8_ = in_XMM3_Qb;
      auVar4._0_8_ = uVar20;
      uVar2 = vmovlps_avx(auVar4);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar2 >> 0x20);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = fVar21;
      __return_storage_ptr__->time = time;
      (__return_storage_ptr__->medium).
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = 0;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Ray SpawnRay(Point3fi pi, Normal3f n, Float time, Vector3f d) {
    return Ray(OffsetRayOrigin(pi, n, d), d, time);
}